

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Sphere::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Sphere *this,Ray *r,
          Float tMax)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Interval a;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Interval i;
  Interval a_00;
  Interval i_00;
  float fVar15;
  float fVar16;
  Interval c_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  Interval IVar26;
  Interval IVar27;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar32 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar34 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar74;
  float fVar75;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar76;
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  Vector3fi di;
  Point3fi oi;
  Interval b;
  Point3fi fp;
  Interval c;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  Point3fi local_e8;
  Point3fi local_c8;
  Interval local_a8;
  float local_9c;
  Float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  Vector3<pbrt::Interval> local_68;
  Point3fi local_50;
  Interval local_38;
  Interval local_30;
  undefined1 local_28 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  
  fVar15 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar33._4_4_ = fVar15;
  auVar33._0_4_ = fVar15;
  auVar33._8_4_ = fVar15;
  auVar33._12_4_ = fVar15;
  fVar15 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar55._4_4_ = fVar15;
  auVar55._0_4_ = fVar15;
  auVar55._8_4_ = fVar15;
  auVar55._12_4_ = fVar15;
  local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar33,auVar55);
  fVar15 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar21._4_4_ = fVar15;
  auVar21._0_4_ = fVar15;
  auVar21._8_4_ = fVar15;
  auVar21._12_4_ = fVar15;
  local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar21);
  local_98 = tMax;
  Transform::operator()(&local_c8,this->objectFromRender,&local_e8);
  fVar15 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar17._4_4_ = fVar15;
  auVar17._0_4_ = fVar15;
  auVar17._8_4_ = fVar15;
  auVar17._12_4_ = fVar15;
  fVar15 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar56._4_4_ = fVar15;
  auVar56._0_4_ = fVar15;
  auVar56._8_4_ = fVar15;
  auVar56._12_4_ = fVar15;
  local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar17,auVar56);
  fVar15 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar57._4_4_ = fVar15;
  auVar57._0_4_ = fVar15;
  auVar57._8_4_ = fVar15;
  auVar57._12_4_ = fVar15;
  local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar57);
  Transform::operator()((Vector3fi *)&local_e8,this->objectFromRender,(Vector3fi *)&local_50);
  IVar26 = local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  auVar82._8_8_ = 0;
  auVar82._0_4_ =
       local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar82._4_4_ =
       local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar23._8_4_ = 0x7fffffff;
  auVar23._0_8_ = 0x7fffffff7fffffff;
  auVar23._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx512vl(auVar82,auVar23);
  auVar33 = vshufps_avx(auVar17,auVar17,0xf5);
  auVar23 = vmaxss_avx(auVar17,auVar33);
  fVar15 = auVar23._0_4_;
  if ((0.0 < local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
     || (auVar23 = vmovshdup_avx(auVar82), auVar23._0_4_ < 0.0)) {
    auVar23 = vminss_avx(auVar33,auVar17);
    fVar16 = auVar23._0_4_ * auVar23._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar16 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar16);
    fVar15 = fVar15 * fVar15;
    if (fVar15 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT816(0),0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar15);
      fVar15 = (float)((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar23 = ZEXT416((int)fVar16 + -1 + (uint)(fVar16 <= 0.0) * 2);
    auVar33 = vminss_avx(ZEXT416((uint)fVar15),auVar23);
    auVar23 = vmaxss_avx(ZEXT416((uint)fVar15),auVar23);
    auVar23 = vinsertps_avx(auVar33,auVar23,0x10);
    IVar27 = auVar23._0_8_;
  }
  else {
    fVar15 = fVar15 * fVar15;
    if (fVar15 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT816(0) << 0x40,0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar15);
      fVar15 = (float)((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar58._4_4_ = fVar15;
    auVar58._0_4_ = fVar15;
    auVar58._8_4_ = fVar15;
    auVar58._12_4_ = fVar15;
    auVar23 = vpblendd_avx2(auVar58,ZEXT416(0) << 0x40,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)fVar15),auVar23,1);
    IVar27.high = (Float)((uint)((byte)(uVar1 >> 1) & 1) * (int)fVar15);
    IVar27.low = (Float)((uint)((byte)uVar1 & 1) * (int)fVar15);
  }
  auVar37._0_8_ =
       FMA(local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,
           local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,IVar27
          );
  auVar37._8_56_ = extraout_var_05;
  auVar23 = vmaxss_avx(auVar37._0_16_,ZEXT816(0) << 0x40);
  auVar17 = vmovshdup_avx(auVar37._0_16_);
  auVar33 = vminss_avx(auVar17,auVar23);
  auVar23 = vmaxss_avx(auVar17,auVar23);
  auVar23 = vinsertps_avx(auVar33,auVar23,0x10);
  IVar26 = FMA(IVar26,IVar26,auVar23._0_8_);
  local_108._8_8_ = extraout_XMM0_Qb;
  local_108._0_4_ = IVar26.low;
  local_108._4_4_ = IVar26.high;
  IVar26.high = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
  IVar26.low = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               low;
  IVar26 = Interval::operator*((Interval *)&local_e8,IVar26);
  i.high = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  i.low = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  IVar27 = Interval::operator*(&local_e8.super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,i);
  local_118._0_4_ = IVar26.low;
  local_118._4_4_ = IVar26.high;
  uStack_110._0_4_ = (float)extraout_XMM0_Qb_00;
  uStack_110._4_4_ = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  fVar15 = (float)local_118._0_4_ + IVar27.low;
  if (-INFINITY < fVar15) {
    auVar66._0_12_ = ZEXT812(0);
    auVar66._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar66,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
    fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
  }
  auVar28._0_4_ = (float)local_118._0_4_ + IVar27.low;
  auVar28._4_4_ = (float)local_118._4_4_ + IVar27.high;
  auVar28._8_4_ = (float)uStack_110 + (float)extraout_XMM0_Qb_01;
  auVar28._12_4_ = uStack_110._4_4_ + (float)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  auVar23 = vmovshdup_avx(auVar28);
  if (auVar23._0_4_ < INFINITY) {
    uVar3 = vcmpss_avx512f(auVar23,ZEXT816(0) << 0x40,0);
    fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar23._0_4_);
    auVar23 = ZEXT416((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
  }
  auVar33 = vminss_avx(auVar23,ZEXT416((uint)fVar15));
  auVar23 = vmaxss_avx(auVar23,ZEXT416((uint)fVar15));
  i_00.high = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              high;
  i_00.low = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar38._0_8_ =
       Interval::operator*(&local_e8.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z,i_00);
  auVar38._8_56_ = extraout_var_06;
  fVar15 = auVar38._0_4_ + auVar33._0_4_;
  if (-INFINITY < fVar15) {
    auVar67._0_12_ = ZEXT812(0);
    auVar67._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar67,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
    fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
  }
  auVar33 = vmovshdup_avx(auVar38._0_16_);
  fVar16 = auVar33._0_4_ + auVar23._0_4_;
  if (fVar16 < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
    fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
    fVar16 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
  }
  auVar33 = vminss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  auVar23 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  auVar23 = vinsertps_avx(auVar33,auVar23,0x10);
  auVar59._8_4_ = 0x40000000;
  auVar59._0_8_ = 0x4000000040000000;
  auVar59._12_4_ = 0x40000000;
  IVar26 = (Interval)vmovlps_avx(auVar59);
  local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = IVar26;
  auVar39._0_8_ = Interval::operator*((Interval *)&local_50,auVar23._0_8_);
  auVar39._8_56_ = extraout_var_07;
  local_a8 = (Interval)vmovlps_avx(auVar39._0_16_);
  a.high = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  a.low = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  a_00.high = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              high;
  a_00.low = local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar84._4_4_ =
       local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar84._0_4_ =
       local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar84._8_8_ = 0;
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx512vl(auVar84,auVar5);
  auVar33 = vshufps_avx(auVar17,auVar17,0xf5);
  auVar23 = vmaxss_avx(auVar17,auVar33);
  fVar15 = auVar23._0_4_;
  if ((0.0 < local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
     || (auVar23 = vmovshdup_avx(auVar84), auVar23._0_4_ < 0.0)) {
    auVar23 = vminss_avx(auVar33,auVar17);
    fVar16 = auVar23._0_4_ * auVar23._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar16 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar16);
    fVar15 = fVar15 * fVar15;
    if (fVar15 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT816(0),0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar15);
      fVar15 = (float)((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar23 = ZEXT416((int)fVar16 + -1 + (uint)(fVar16 <= 0.0) * 2);
    auVar33 = vminss_avx(ZEXT416((uint)fVar15),auVar23);
    auVar23 = vmaxss_avx(ZEXT416((uint)fVar15),auVar23);
    auVar23 = vinsertps_avx(auVar33,auVar23,0x10);
    c_00 = auVar23._0_8_;
  }
  else {
    fVar15 = fVar15 * fVar15;
    if (fVar15 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT816(0) << 0x40,0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar15);
      fVar15 = (float)((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar60._4_4_ = fVar15;
    auVar60._0_4_ = fVar15;
    auVar60._8_4_ = fVar15;
    auVar60._12_4_ = fVar15;
    auVar23 = vpblendd_avx2(auVar60,ZEXT416(0) << 0x40,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)fVar15),auVar23,1);
    c_00.high = (Float)((uint)((byte)(uVar1 >> 1) & 1) * (int)fVar15);
    c_00.low = (Float)((uint)((byte)uVar1 & 1) * (int)fVar15);
  }
  auVar33 = vmaxss_avx(local_108,ZEXT416(0));
  auVar55 = vmovshdup_avx(local_108);
  auVar40._0_8_ = FMA(a_00,a_00,c_00);
  auVar40._8_56_ = extraout_var_08;
  auVar23 = vmaxss_avx(auVar40._0_16_,ZEXT816(0) << 0x40);
  auVar21 = vmovshdup_avx(auVar40._0_16_);
  auVar17 = vminss_avx(auVar21,auVar23);
  auVar23 = vmaxss_avx(auVar21,auVar23);
  auVar23 = vinsertps_avx(auVar17,auVar23,0x10);
  auVar41._0_8_ = FMA(a,a,auVar23._0_8_);
  auVar41._8_56_ = extraout_var_09;
  auVar57 = ZEXT816(0) << 0x40;
  auVar23 = vmaxss_avx(auVar41._0_16_,auVar57);
  auVar21 = vmovshdup_avx(auVar41._0_16_);
  auVar17 = vminss_avx(auVar21,auVar23);
  fVar15 = this->radius;
  fVar16 = fVar15 * fVar15;
  auVar56 = ZEXT416((uint)fVar16);
  if ((fVar15 != 0.0) || (NAN(fVar15))) {
    uVar3 = vcmpss_avx512f(auVar56,auVar57,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar16);
    if (fVar16 < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar56,auVar57,0);
      fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
      auVar56 = ZEXT416((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
    }
    auVar82 = ZEXT416((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
    auVar57 = vminss_avx(auVar56,auVar82);
    auVar56 = vmaxss_avx(auVar56,auVar82);
    auVar18 = vinsertps_avx(auVar57,auVar56,0x10);
  }
  else {
    if (fVar16 < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar56,ZEXT816(0) << 0x40,0);
      fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16 + 1);
    }
    auVar77._4_4_ = fVar16;
    auVar77._0_4_ = fVar16;
    auVar77._8_4_ = fVar16;
    auVar77._12_4_ = fVar16;
    auVar56 = vpblendd_avx2(auVar77,ZEXT816(0) << 0x40,0xd);
    auVar81._4_12_ = ZEXT812(0) << 0x20;
    auVar81._0_4_ = fVar16;
    uVar1 = vcmpps_avx512vl(auVar81,auVar56,1);
    auVar18._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * (int)fVar16;
    auVar18._0_4_ = (uint)((byte)uVar1 & 1) * (int)fVar16;
    auVar18._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * (int)fVar16;
    auVar18._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * (int)fVar16;
  }
  auVar56 = vminss_avx(auVar55,ZEXT416(auVar33._0_4_));
  auVar33 = vmaxss_avx(auVar55,ZEXT416(auVar33._0_4_));
  auVar23 = vmaxss_avx(auVar21,auVar23);
  auVar55 = vmovshdup_avx(auVar18);
  fVar15 = auVar17._0_4_ - auVar55._0_4_;
  if (-INFINITY < fVar15) {
    auVar68._0_12_ = ZEXT812(0);
    auVar68._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar68,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
    fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
  }
  auVar33 = vinsertps_avx(auVar56,auVar33,0x10);
  fVar16 = auVar23._0_4_ - auVar18._0_4_;
  if (fVar16 < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x20,0);
    fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
    fVar16 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
  }
  auVar17 = vminss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  auVar23 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  auVar23 = vinsertps_avx(auVar17,auVar23,0x10);
  local_30 = (Interval)vmovlps_avx(auVar23);
  auVar29._8_4_ = 0x40000000;
  auVar29._0_8_ = 0x4000000040000000;
  auVar29._12_4_ = 0x40000000;
  local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       (Interval)vmovlps_avx(auVar29);
  local_108._0_8_ = auVar33._0_8_;
  IVar26 = Interval::operator*((Interval *)&local_50,(Interval)local_108._0_8_);
  auVar42._0_8_ = Interval::operator/(&local_a8,IVar26);
  auVar42._8_56_ = extraout_var_10;
  local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       (Interval)vmovlps_avx(auVar42._0_16_);
  IVar26 = Interval::operator*((Interval *)&local_50,
                               local_e8.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
  uStack_110 = extraout_XMM0_Qb_02;
  local_118._0_4_ = IVar26.low;
  local_118._4_4_ = IVar26.high;
  IVar26 = Interval::operator*((Interval *)&local_50,
                               local_e8.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  local_f8._8_8_ = extraout_XMM0_Qb_03;
  local_f8._0_4_ = IVar26.low;
  local_f8._4_4_ = IVar26.high;
  auVar43._0_8_ =
       Interval::operator*((Interval *)&local_50,
                           local_e8.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z);
  auVar43._8_56_ = extraout_var_11;
  local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>._0_16_ = vunpcklpd_avx(_local_118,local_f8);
  local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z = (Interval)vmovlps_avx(auVar43._0_16_);
  Point3fi::operator-(&local_50,&local_c8,&local_68);
  auVar83._8_8_ = 0;
  auVar83._0_4_ =
       local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar83._4_4_ =
       local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx512vl(auVar83,auVar6);
  auVar33 = vshufps_avx(auVar17,auVar17,0xf5);
  auVar23 = vmaxss_avx(auVar17,auVar33);
  fVar15 = auVar23._0_4_;
  if ((0.0 < local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low)
     || (auVar23 = vmovshdup_avx(auVar83), auVar23._0_4_ < 0.0)) {
    auVar23 = vminss_avx(auVar33,auVar17);
    fVar16 = auVar23._0_4_ * auVar23._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar16 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar16);
    fVar15 = fVar15 * fVar15;
    if (fVar15 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT816(0),0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar15);
      fVar15 = (float)((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar23 = ZEXT416((int)fVar16 + -1 + (uint)(fVar16 <= 0.0) * 2);
    auVar33 = vminss_avx(ZEXT416((uint)fVar15),auVar23);
    auVar23 = vmaxss_avx(ZEXT416((uint)fVar15),auVar23);
    auVar19 = vinsertps_avx(auVar33,auVar23,0x10);
  }
  else {
    fVar15 = fVar15 * fVar15;
    if (fVar15 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT816(0) << 0x40,0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar15);
      fVar15 = (float)((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar30._4_4_ = fVar15;
    auVar30._0_4_ = fVar15;
    auVar30._8_4_ = fVar15;
    auVar30._12_4_ = fVar15;
    auVar23 = vpblendd_avx2(auVar30,ZEXT416(0) << 0x40,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)fVar15),auVar23,1);
    auVar19._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * (int)fVar15;
    auVar19._0_4_ = (uint)((byte)uVar1 & 1) * (int)fVar15;
    auVar19._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * (int)fVar15;
    auVar19._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * (int)fVar15;
  }
  auVar85._8_8_ = 0;
  auVar85._0_4_ =
       local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar85._4_4_ =
       local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar7._8_4_ = 0x7fffffff;
  auVar7._0_8_ = 0x7fffffff7fffffff;
  auVar7._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx512vl(auVar85,auVar7);
  auVar33 = vshufps_avx(auVar17,auVar17,0xf5);
  auVar23 = vmaxss_avx(auVar17,auVar33);
  auVar11._12_4_ = 0;
  auVar11._0_12_ = ZEXT812(0);
  fVar15 = auVar23._0_4_;
  if ((0.0 < local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low)
     || (auVar23 = vmovshdup_avx(auVar85), auVar23._0_4_ < 0.0)) {
    auVar23 = vminss_avx(auVar33,auVar17);
    fVar16 = auVar23._0_4_ * auVar23._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),auVar11 << 0x20,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar16 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar16);
    fVar15 = fVar15 * fVar15;
    if (fVar15 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),ZEXT816(0),0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar15);
      fVar15 = (float)((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar23 = ZEXT416((int)fVar16 + -1 + (uint)(fVar16 <= 0.0) * 2);
    auVar33 = vminss_avx(ZEXT416((uint)fVar15),auVar23);
    auVar23 = vmaxss_avx(ZEXT416((uint)fVar15),auVar23);
    auVar20 = vinsertps_avx(auVar33,auVar23,0x10);
  }
  else {
    fVar15 = fVar15 * fVar15;
    if (fVar15 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar11 << 0x20,0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar15);
      fVar15 = (float)((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar31._4_4_ = fVar15;
    auVar31._0_4_ = fVar15;
    auVar31._8_4_ = fVar15;
    auVar31._12_4_ = fVar15;
    auVar23 = vpblendd_avx2(auVar31,ZEXT416(0) << 0x20,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)fVar15),auVar23,1);
    auVar20._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * (int)fVar15;
    auVar20._0_4_ = (uint)((byte)uVar1 & 1) * (int)fVar15;
    auVar20._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * (int)fVar15;
    auVar20._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * (int)fVar15;
  }
  fVar15 = auVar19._0_4_ + auVar20._0_4_;
  if (-INFINITY < fVar15) {
    auVar78._0_12_ = ZEXT812(0);
    auVar78._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar78,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
    fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
  }
  auVar61._0_4_ = auVar19._0_4_ + auVar20._0_4_;
  auVar61._4_4_ = auVar19._4_4_ + auVar20._4_4_;
  auVar61._8_4_ = auVar19._8_4_ + auVar20._8_4_;
  auVar61._12_4_ = auVar19._12_4_ + auVar20._12_4_;
  auVar23 = vmovshdup_avx(auVar61);
  if (auVar23._0_4_ < INFINITY) {
    uVar3 = vcmpss_avx512f(auVar23,ZEXT816(0) << 0x20,0);
    fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar23._0_4_);
    auVar23 = ZEXT416((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
  }
  auVar17 = vminss_avx(auVar23,ZEXT416((uint)fVar15));
  auVar86._8_8_ = 0;
  auVar86._0_4_ =
       local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low;
  auVar86._4_4_ =
       local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx512vl(auVar86,auVar8);
  auVar55 = vshufps_avx(auVar21,auVar21,0xf5);
  auVar33 = vmaxss_avx(auVar21,auVar55);
  auVar12._12_4_ = 0;
  auVar12._0_12_ = ZEXT812(0);
  fVar16 = auVar33._0_4_;
  if ((0.0 < local_50.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
     || (auVar33 = vmovshdup_avx(auVar86), auVar33._0_4_ < 0.0)) {
    auVar33 = vminss_avx(auVar55,auVar21);
    fVar24 = auVar33._0_4_ * auVar33._0_4_;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar24),auVar12 << 0x20,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar24 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar24);
    fVar16 = fVar16 * fVar16;
    if (fVar16 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0),0);
      fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
      fVar16 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
    }
    auVar33 = ZEXT416((int)fVar24 + -1 + (uint)(fVar24 <= 0.0) * 2);
    auVar55 = vminss_avx(ZEXT416((uint)fVar16),auVar33);
    auVar33 = vmaxss_avx(ZEXT416((uint)fVar16),auVar33);
    auVar22 = vinsertps_avx(auVar55,auVar33,0x10);
  }
  else {
    fVar16 = fVar16 * fVar16;
    if (fVar16 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),auVar12 << 0x20,0);
      fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
      fVar16 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
    }
    auVar79._4_4_ = fVar16;
    auVar79._0_4_ = fVar16;
    auVar79._8_4_ = fVar16;
    auVar79._12_4_ = fVar16;
    auVar33 = vpblendd_avx2(auVar79,ZEXT416(0) << 0x20,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)fVar16),auVar33,1);
    auVar22._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * (int)fVar16;
    auVar22._0_4_ = (uint)((byte)uVar1 & 1) * (int)fVar16;
    auVar22._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * (int)fVar16;
    auVar22._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * (int)fVar16;
  }
  auVar23 = vmaxss_avx(auVar23,ZEXT416((uint)fVar15));
  fVar15 = auVar17._0_4_ + auVar22._0_4_;
  if (-INFINITY < fVar15) {
    auVar62._0_12_ = ZEXT812(0);
    auVar62._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar62,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
    fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
  }
  auVar33 = vmovshdup_avx(auVar22);
  fVar16 = auVar23._0_4_ + auVar33._0_4_;
  if (fVar16 < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x20,0);
    fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
    fVar16 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
  }
  auVar23 = vminss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  if (auVar23._0_4_ < 0.0) {
    auVar44._0_4_ = sqrtf(auVar23._0_4_);
    auVar44._4_60_ = extraout_var;
    auVar23 = auVar44._0_16_;
  }
  else {
    auVar23 = vsqrtss_avx(auVar23,auVar23);
  }
  auVar33 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  if (-INFINITY < auVar23._0_4_) {
    auVar63._0_12_ = ZEXT812(0);
    auVar63._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar23,auVar63,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)auVar23._0_4_);
    auVar23 = ZEXT416((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
  }
  if (auVar33._0_4_ < 0.0) {
    auVar45._0_4_ = sqrtf(auVar33._0_4_);
    auVar45._4_60_ = extraout_var_00;
    auVar33 = auVar45._0_16_;
  }
  else {
    auVar33 = vsqrtss_avx(auVar33,auVar33);
  }
  if (auVar33._0_4_ < INFINITY) {
    uVar3 = vcmpss_avx512f(auVar33,ZEXT816(0) << 0x40,0);
    fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar33._0_4_);
    auVar33 = ZEXT416((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
  }
  auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x40);
  auVar17 = vminss_avx(auVar33,auVar23);
  auVar23 = vmaxss_avx(auVar33,auVar23);
  auVar32._8_4_ = 0x40800000;
  auVar32._0_8_ = 0x4080000040800000;
  auVar32._12_4_ = 0x40800000;
  local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar32);
  auVar46._0_8_ = Interval::operator*((Interval *)&local_68,(Interval)local_108._0_8_);
  auVar46._8_56_ = extraout_var_12;
  local_38 = (Interval)vmovlps_avx(auVar46._0_16_);
  fVar15 = this->radius + auVar17._0_4_;
  if (-INFINITY < fVar15) {
    auVar69._0_12_ = ZEXT812(0);
    auVar69._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar69,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
    fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
  }
  fVar16 = this->radius + auVar23._0_4_;
  if (fVar16 < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
    fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
    fVar16 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
  }
  auVar55 = vminss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  auVar33 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  auVar33 = vinsertps_avx(auVar55,auVar33,0x10);
  auVar47._0_8_ = Interval::operator*(&local_38,auVar33._0_8_);
  auVar47._8_56_ = extraout_var_13;
  uVar3 = vmovlps_avx(auVar47._0_16_);
  local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low = (Float)(int)uVar3;
  local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high = (Float)(int)((ulong)uVar3 >> 0x20);
  fVar15 = this->radius - auVar23._0_4_;
  if (-INFINITY < fVar15) {
    auVar70._0_12_ = ZEXT812(0);
    auVar70._12_4_ = 0;
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar70,0);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
    fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
  }
  fVar16 = this->radius - auVar17._0_4_;
  if (fVar16 < INFINITY) {
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
    fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
    fVar16 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
  }
  auVar33 = vminss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  auVar23 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
  auVar23 = vinsertps_avx(auVar33,auVar23,0x10);
  auVar48._0_8_ = Interval::operator*((Interval *)&local_68,auVar23._0_8_);
  auVar48._8_56_ = extraout_var_14;
  auVar23 = auVar48._0_16_;
  fVar15 = auVar48._0_4_;
  if (0.0 <= fVar15) {
    if (fVar15 < 0.0) {
      auVar49._0_4_ = sqrtf(fVar15);
      auVar49._4_60_ = extraout_var_01;
      auVar33 = auVar49._0_16_;
    }
    else {
      auVar33 = vsqrtss_avx(auVar23,auVar23);
    }
    if (-INFINITY < auVar33._0_4_) {
      auVar34._0_12_ = ZEXT812(0);
      auVar34._12_4_ = 0;
      uVar3 = vcmpss_avx512f(auVar33,auVar34,0);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)auVar33._0_4_);
      auVar33 = ZEXT416((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
    }
    auVar23 = vmovshdup_avx(auVar23);
    if (auVar23._0_4_ < 0.0) {
      auVar50._0_4_ = sqrtf(auVar23._0_4_);
      auVar50._4_60_ = extraout_var_02;
      auVar23 = auVar50._0_16_;
    }
    else {
      auVar23 = vsqrtss_avx(auVar23,auVar23);
    }
    if (auVar23._0_4_ < INFINITY) {
      uVar3 = vcmpss_avx512f(auVar23,ZEXT816(0) << 0x40,0);
      fVar15 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)auVar23._0_4_);
      auVar23 = ZEXT416((-(uint)(fVar15 < 0.0) | 1) + (int)fVar15);
    }
    auVar33 = vmaxss_avx(auVar33,ZEXT816(0) << 0x40);
    auVar17 = vminss_avx(auVar23,auVar33);
    auVar23 = vmaxss_avx(auVar23,auVar33);
    if (0.0 <= (local_a8.low + local_a8.high) * 0.5) {
      fVar15 = auVar17._0_4_ + local_a8.low;
      if (-INFINITY < fVar15) {
        auVar71._0_12_ = ZEXT812(0);
        auVar71._12_4_ = 0;
        uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar71,0);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
        fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
      }
      fVar16 = auVar23._0_4_ + local_a8.high;
    }
    else {
      fVar15 = local_a8.low - auVar23._0_4_;
      if (-INFINITY < fVar15) {
        auVar80._0_12_ = ZEXT812(0);
        auVar80._12_4_ = 0;
        uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar15),auVar80,0);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar15 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar15);
        fVar15 = (float)((int)fVar15 + -1 + (uint)(fVar15 <= 0.0) * 2);
      }
      fVar16 = local_a8.high - auVar17._0_4_;
    }
    if (fVar16 < INFINITY) {
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar16),ZEXT816(0) << 0x40,0);
      fVar16 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar16);
      fVar16 = (float)((-(uint)(fVar16 < 0.0) | 1) + (int)fVar16);
    }
    auVar33 = vminss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
    auVar23 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar15));
    auVar23 = vinsertps_avx(auVar33,auVar23,0x10);
    auVar64._8_4_ = 0xbf000000;
    auVar64._0_8_ = 0xbf000000bf000000;
    auVar64._12_4_ = 0xbf000000;
    local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar64);
    auVar51._0_8_ = Interval::operator*((Interval *)&local_68,auVar23._0_8_);
    auVar51._8_56_ = extraout_var_15;
    uVar3 = vmovlps_avx(auVar51._0_16_);
    local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low = (Float)(int)uVar3;
    local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high = (Float)(int)((ulong)uVar3 >> 0x20)
    ;
    IVar26 = Interval::operator/((Interval *)&local_68,(Interval)local_108._0_8_);
    local_108._8_8_ = extraout_XMM0_Qb_04;
    local_108._0_4_ = IVar26.low;
    local_108._4_4_ = IVar26.high;
    auVar52._0_8_ =
         Interval::operator/(&local_30,local_68.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x);
    auVar52._8_56_ = extraout_var_16;
    auVar23 = auVar52._0_16_;
    auVar33 = local_108;
    if (IVar26.low <= auVar52._0_4_) {
      auVar33 = auVar23;
      auVar23 = local_108;
    }
    local_28 = vmovshdup_avx(auVar23);
    if (((local_98 < local_28._0_4_) || (fVar15 = auVar33._0_4_, fVar15 <= 0.0)) ||
       ((local_78 = vmovshdup_avx(auVar33), auVar23._0_4_ <= 0.0 &&
        (local_28 = local_78, auVar23 = auVar33, local_98 < local_78._0_4_)))) goto LAB_002ece13;
    auVar13._4_4_ =
         local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
    auVar13._0_4_ =
         local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
    auVar13._8_4_ =
         local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
    auVar13._12_4_ =
         local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    fVar25 = auVar23._0_4_;
    fVar24 = (fVar25 + local_28._0_4_) * 0.5;
    fVar16 = (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
             + local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               high) * 0.5 +
             fVar24 * (local_e8.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      local_e8.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    auVar23 = vinsertps_avx(auVar13,ZEXT416((uint)local_c8.super_Point3<pbrt::Interval>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high)
                            ,0x10);
    auVar33 = vinsertps_avx((undefined1  [16])
                            local_e8.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                            ZEXT416((uint)local_e8.super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    local_88._0_4_ =
         (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
         auVar23._0_4_) * 0.5 +
         fVar24 * (local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   x.high + auVar33._0_4_) * 0.5;
    local_88._4_4_ =
         (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
         auVar23._4_4_) * 0.5 +
         fVar24 * (local_e8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   y.low + auVar33._4_4_) * 0.5;
    fStack_80 = (auVar23._8_4_ + 0.0) * 0.5 + fVar24 * (auVar33._8_4_ + 0.0) * 0.5;
    fStack_7c = (auVar23._12_4_ + 0.0) * 0.5 + fVar24 * (auVar33._12_4_ + 0.0) * 0.5;
    auVar35._0_4_ = (float)local_88._0_4_ * (float)local_88._0_4_;
    auVar35._4_4_ = (float)local_88._4_4_ * (float)local_88._4_4_;
    auVar35._8_4_ = fStack_80 * fStack_80;
    auVar35._12_4_ = fStack_7c * fStack_7c;
    auVar23 = vhaddps_avx(auVar35,auVar35);
    fVar24 = auVar23._0_4_ + fVar16 * fVar16;
    if (fVar24 < 0.0) {
      local_9c = this->radius;
      fVar65 = sqrtf(fVar24);
      fVar24 = local_9c;
    }
    else {
      auVar23 = vsqrtss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      fVar65 = auVar23._0_4_;
      fVar24 = this->radius;
    }
    fVar24 = fVar24 / fVar65;
    local_88._0_4_ = (float)local_88._0_4_ * fVar24;
    local_88._4_4_ = (float)local_88._4_4_ * fVar24;
    fStack_80 = fStack_80 * fVar24;
    fStack_7c = fStack_7c * fVar24;
    auVar23 = vmovshdup_avx(_local_88);
    auVar72 = _local_88;
    if ((auVar23._0_4_ == 0.0) && (!NAN(auVar23._0_4_))) {
      auVar72._4_12_ = local_88._4_12_;
      auVar72._0_4_ = this->radius * 1e-05;
    }
    if (((float)local_88._0_4_ == 0.0) && (!NAN((float)local_88._0_4_))) {
      _local_88 = auVar72;
    }
    fVar24 = fVar24 * fVar16;
    auVar23 = vmovshdup_avx(_local_88);
    auVar53._0_4_ = atan2f(auVar23._0_4_,local_88._0_4_);
    auVar53._4_60_ = extraout_var_03;
    fVar16 = this->radius;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar23 = vxorps_avx512vl(ZEXT416((uint)fVar16),auVar9);
    if ((this->zMin <= auVar23._0_4_) || (this->zMin <= fVar24)) {
      uVar1 = vcmpps_avx512vl(ZEXT416((uint)this->zMax),ZEXT416((uint)fVar16),1);
      uVar2 = vcmpps_avx512vl(ZEXT416((uint)this->zMax),ZEXT416((uint)fVar24),1);
      if ((uVar1 & uVar2 & 1) == 0) {
        uVar3 = vcmpss_avx512f(auVar53._0_16_,ZEXT816(0) << 0x20,1);
        bVar4 = (bool)((byte)uVar3 & 1);
        fVar65 = (float)((uint)bVar4 * (int)(auVar53._0_4_ + 6.2831855) +
                        (uint)!bVar4 * (int)auVar53._0_4_);
        if (fVar65 <= this->phiMax) goto LAB_002ecd32;
      }
    }
    if ((fVar25 == fVar15) && (!NAN(fVar25) && !NAN(fVar15))) {
      if (((float)local_28._0_4_ == (float)local_78._0_4_) &&
         (!NAN((float)local_28._0_4_) && !NAN((float)local_78._0_4_))) goto LAB_002ece13;
    }
    if ((float)local_78._0_4_ <= local_98) {
      auVar14._4_4_ =
           local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar14._0_4_ =
           local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar14._8_4_ =
           local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar14._12_4_ =
           local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      fVar24 = (fVar15 + (float)local_78._0_4_) * 0.5;
      auVar23 = vinsertps_avx(auVar14,ZEXT416((uint)local_c8.super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auVar33 = vinsertps_avx((undefined1  [16])
                              local_e8.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                              ZEXT416((uint)local_e8.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10)
      ;
      fVar65 = (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high + auVar23._0_4_) * 0.5 +
               fVar24 * (local_e8.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high + auVar33._0_4_) * 0.5;
      fVar74 = (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                low + auVar23._4_4_) * 0.5 +
               fVar24 * (local_e8.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low + auVar33._4_4_) * 0.5;
      fVar75 = (auVar23._8_4_ + 0.0) * 0.5 + fVar24 * (auVar33._8_4_ + 0.0) * 0.5;
      fVar76 = (auVar23._12_4_ + 0.0) * 0.5 + fVar24 * (auVar33._12_4_ + 0.0) * 0.5;
      auVar36._0_4_ = fVar65 * fVar65;
      auVar36._4_4_ = fVar74 * fVar74;
      auVar36._8_4_ = fVar75 * fVar75;
      auVar36._12_4_ = fVar76 * fVar76;
      auVar23 = vhaddps_avx(auVar36,auVar36);
      fVar24 = (local_c8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low + local_c8.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 +
               fVar24 * (local_e8.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                        local_e8.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      fVar25 = auVar23._0_4_ + fVar24 * fVar24;
      if (fVar25 < 0.0) {
        local_98 = fVar65;
        fStack_94 = fVar74;
        fStack_90 = fVar75;
        fStack_8c = fVar76;
        fVar25 = sqrtf(fVar25);
        fVar65 = local_98;
        fVar74 = fStack_94;
        fVar75 = fStack_90;
        fVar76 = fStack_8c;
      }
      else {
        auVar23 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
        fVar25 = auVar23._0_4_;
      }
      fVar16 = fVar16 / fVar25;
      local_88._0_4_ = fVar65 * fVar16;
      local_88._4_4_ = fVar74 * fVar16;
      fStack_80 = fVar75 * fVar16;
      fStack_7c = fVar76 * fVar16;
      auVar23 = vmovshdup_avx(_local_88);
      auVar73 = _local_88;
      if ((auVar23._0_4_ == 0.0) && (!NAN(auVar23._0_4_))) {
        auVar73._4_12_ = local_88._4_12_;
        auVar73._0_4_ = this->radius * 1e-05;
      }
      if (((float)local_88._0_4_ == 0.0) && (!NAN((float)local_88._0_4_))) {
        _local_88 = auVar73;
      }
      fVar24 = fVar16 * fVar24;
      auVar23 = vmovshdup_avx(_local_88);
      auVar54._0_4_ = atan2f(auVar23._0_4_,local_88._0_4_);
      auVar54._4_60_ = extraout_var_04;
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar23 = vxorps_avx512vl(ZEXT416((uint)this->radius),auVar10);
      if ((this->zMin <= auVar23._0_4_) || (this->zMin <= fVar24)) {
        uVar1 = vcmpps_avx512vl(ZEXT416((uint)this->zMax),ZEXT416((uint)this->radius),1);
        uVar2 = vcmpps_avx512vl(ZEXT416((uint)this->zMax),ZEXT416((uint)fVar24),1);
        if ((uVar1 & uVar2 & 1) == 0) {
          uVar3 = vcmpss_avx512f(auVar54._0_16_,ZEXT816(0),1);
          bVar4 = (bool)((byte)uVar3 & 1);
          fVar65 = (float)((uint)bVar4 * (int)(auVar54._0_4_ + 6.2831855) +
                          (uint)!bVar4 * (int)auVar54._0_4_);
          if (fVar65 <= this->phiMax) {
            fVar25 = fVar15;
            local_28._0_4_ = local_78._0_4_;
LAB_002ecd32:
            __return_storage_ptr__->set = true;
            *(float *)&__return_storage_ptr__->optionalValue =
                 (fVar25 + (float)local_28._0_4_) * 0.5;
            uVar3 = vmovlps_avx(_local_88);
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar3;
            *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar24;
            *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar65;
            return __return_storage_ptr__;
          }
        }
      }
    }
  }
LAB_002ece13:
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to compute sphere _t0_ and _t1_
        Interval t0, t1;
        // Compute sphere quadratic coefficients
        Interval a = SumSquares(di.x, di.y, di.z);
        Interval b = 2 * (di.x * oi.x + di.y * oi.y + di.z * oi.z);
        Interval c = SumSquares(oi.x, oi.y, oi.z) - Sqr(Interval(radius));

        // Compute sphere quadratic discriminant _discrim_
        Interval f = b / (2 * a);
        Point3fi fp = oi - f * di;
        Interval sqrtf = Sqrt(Sqr(fp.x) + Sqr(fp.y) + Sqr(fp.z));
        Interval discrim =
            4 * a * (Interval(radius) + sqrtf) * (Interval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        Interval rootDiscrim = Sqrt(discrim);
        Interval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        Interval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute sphere hit position and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine sphere intersection point
        pHit *= radius / Distance(pHit, Point3f(0, 0, 0));

        if (pHit.x == 0 && pHit.y == 0)
            pHit.x = 1e-5f * radius;
        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test sphere intersection against clipping parameters
        if ((zMin > -radius && pHit.z < zMin) || (zMax < radius && pHit.z > zMax) ||
            phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            if (t1.UpperBound() > tMax)
                return {};
            tShapeHit = t1;
            // Compute sphere hit position and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine sphere intersection point
            pHit *= radius / Distance(pHit, Point3f(0, 0, 0));

            if (pHit.x == 0 && pHit.y == 0)
                pHit.x = 1e-5f * radius;
            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if ((zMin > -radius && pHit.z < zMin) || (zMax < radius && pHit.z > zMax) ||
                phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for sphere intersection
        return QuadricIntersection{Float(tShapeHit), pHit, phi};
    }